

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O0

string * __thiscall
absl::lts_20250127::strings_internal::
JoinAlgorithm<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,void>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,strings_internal *this,char *start,size_t end,size_t param_5)

{
  bool bVar1;
  reference pbVar2;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *p_Var3;
  reference this_00;
  const_pointer pvVar4;
  size_type sVar5;
  size_type sVar6;
  basic_string_view<char,_std::char_traits<char>_> *value;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  it_1;
  reference local_d0;
  char *result_buf;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t kMaxSize;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  it;
  uint64_t result_size;
  basic_string_view<char,_std::char_traits<char>_> *start_value;
  undefined1 local_30 [8];
  string_view s_local;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  end_local;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  start_local;
  string *result;
  
  local_30 = (undefined1  [8])end;
  s_local._M_len = param_5;
  s_local._M_str = start;
  end_local._M_current = (basic_string_view<char,_std::char_traits<char>_> *)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = __gnu_cxx::operator!=
                    (&end_local,
                     (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)&s_local._M_str);
  if (bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&end_local);
    it._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
    kMaxSize = (uint64_t)end_local._M_current;
    while( true ) {
      p_Var3 = __gnu_cxx::
               __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator++((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)&kMaxSize);
      bVar1 = __gnu_cxx::operator!=
                        (p_Var3,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                 *)&s_local._M_str);
      if (!bVar1) break;
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      it._M_current =
           (basic_string_view<char,_std::char_traits<char>_> *)
           ((long)&(it._M_current)->_M_len + sVar5);
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)&kMaxSize);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
      it._M_current =
           (basic_string_view<char,_std::char_traits<char>_> *)
           ((long)&(it._M_current)->_M_len + sVar5);
    }
    if (it._M_current != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      STLStringResizeUninitialized<std::__cxx11::string,void>
                (__return_storage_ptr__,(size_t)it._M_current);
      it_1._M_current =
           (basic_string_view<char,_std::char_traits<char>_> *)std::__cxx11::string::begin();
      local_d0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&it_1);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar2);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
      memcpy(local_d0,pvVar4,sVar5);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
      local_d0 = local_d0 + sVar5;
      value = end_local._M_current;
      while( true ) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator++((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)&value);
        bVar1 = __gnu_cxx::operator!=
                          (p_Var3,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)&s_local._M_str);
        if (!bVar1) break;
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
        memcpy(local_d0,pvVar4,sVar5);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              *)&value);
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar2);
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
        memcpy(local_d0 + sVar5,pvVar4,sVar6);
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
        local_d0 = local_d0 + sVar5 + sVar6;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          NoFormatter) {
  std::string result;
  if (start != end) {
    // Sums size
    auto&& start_value = *start;
    // Use uint64_t to prevent size_t overflow. We assume it is not possible for
    // in memory strings to overflow a uint64_t.
    uint64_t result_size = start_value.size();
    for (Iterator it = start; ++it != end;) {
      result_size += s.size();
      result_size += (*it).size();
    }

    if (result_size > 0) {
      constexpr uint64_t kMaxSize =
          uint64_t{(std::numeric_limits<size_t>::max)()};
      ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
      STLStringResizeUninitialized(&result, static_cast<size_t>(result_size));

      // Joins strings
      char* result_buf = &*result.begin();

      memcpy(result_buf, start_value.data(), start_value.size());
      result_buf += start_value.size();
      for (Iterator it = start; ++it != end;) {
        memcpy(result_buf, s.data(), s.size());
        result_buf += s.size();
        auto&& value = *it;
        memcpy(result_buf, value.data(), value.size());
        result_buf += value.size();
      }
    }
  }

  return result;
}